

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QPrintDialog::QPrintDialog(QPrintDialog *this,QWidget *parent)

{
  EVP_PKEY_CTX *ctx;
  QPrintDialogPrivate *this_00;
  QPrintDialogPrivate *in_RDI;
  QWidget *unaff_retaddr;
  QPrinter *in_stack_00000008;
  QPrintDialogPrivate *d;
  
  ctx = (EVP_PKEY_CTX *)operator_new(0x4b8);
  QPrintDialogPrivate::QPrintDialogPrivate(in_RDI);
  QAbstractPrintDialog::QAbstractPrintDialog
            ((QAbstractPrintDialog *)parent,&d->super_QAbstractPrintDialogPrivate,in_stack_00000008,
             unaff_retaddr);
  *(undefined ***)&in_RDI->super_QAbstractPrintDialogPrivate = &PTR_metaObject_001aa650;
  *(undefined ***)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x10 =
       &PTR__QPrintDialog_001aa828;
  this_00 = d_func((QPrintDialog *)0x1701a2);
  QPrintDialogPrivate::init(this_00,ctx);
  return;
}

Assistant:

QPrintDialog::QPrintDialog(QWidget *parent)
    : QAbstractPrintDialog(*(new QPrintDialogPrivate), nullptr, parent)
{
    Q_D(QPrintDialog);
    d->init();
}